

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strncasecmp.c
# Opt level: O3

int nn_strncasecmp(char *a,char *b,size_t len)

{
  char cVar1;
  char cVar2;
  int iVar3;
  __int32_t **pp_Var4;
  size_t sVar5;
  
  if (len == 0) {
    return 0;
  }
  sVar5 = 0;
  while( true ) {
    cVar1 = a[sVar5];
    cVar2 = b[sVar5];
    if (cVar1 == '\0' && cVar2 == '\0') {
      return 0;
    }
    pp_Var4 = __ctype_tolower_loc();
    iVar3 = (*pp_Var4)[cVar1] - (*pp_Var4)[cVar2];
    if (iVar3 != 0) break;
    sVar5 = sVar5 + 1;
    if (len == sVar5) {
      return 0;
    }
  }
  return iVar3;
}

Assistant:

int
nn_strncasecmp(const char *a, const char *b, size_t len)
{
	int rv;
	size_t count;
	for (count = 0; count < len; count++) {
		if ((*a == 0) && (*b == 0)) {
			return (0);
		}
		if ((rv = tolower(*a) - tolower(*b)) != 0) {
			return (rv);
		}
		a++;
		b++;
	}
	return (0);
}